

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

atom_t attr_atom_from_string(char *str)

{
  atom_t aVar1;
  
  if (global_as_lock != (atl_lock_func)0x0) {
    (*global_as_lock)(global_as_lock_data);
  }
  if (global_as == (atom_server)0x0) {
    global_as = init_atom_server(prefill_atom_cache);
    if (init_global_atom_server_first == '\0') {
      init_global_atom_server_first = '\x01';
    }
  }
  aVar1 = atom_from_string(global_as,str);
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  return aVar1;
}

Assistant:

extern
 atom_t
attr_atom_from_string(const char *str)
{
    atom_t tmp;
    atl_lock();
    init_global_atom_server(&global_as);
    tmp = atom_from_string(global_as, (char*)str);
    atl_unlock();
    return tmp;
}